

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_dense.hpp
# Opt level: O0

matrix_type * __thiscall
Disa::Matrix_Dense<double,0ul,0ul>::operator+=
          (Matrix_Dense<double,0ul,0ul> *this,Matrix_Dense<double,_2UL,_2UL> *matrix)

{
  bool bVar1;
  ostream *poVar2;
  size_t sVar3;
  const_reference vector;
  Vector_Dense<double,0ul> *this_00;
  source_location *in_RCX;
  ulong local_1f8;
  size_t row;
  string local_1d0;
  string local_1b0;
  string local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  undefined **local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  pair<unsigned_long,_unsigned_long> local_38;
  pair<unsigned_long,_unsigned_long> local_28;
  array<Disa::Vector_Dense<double,_2UL>,_2UL> *local_18;
  Matrix_Dense<double,_2UL,_2UL> *matrix_local;
  Matrix_Dense<double,_0UL,_0UL> *this_local;
  
  local_18 = &matrix->super_array<Disa::Vector_Dense<double,_2UL>,_2UL>;
  matrix_local = (Matrix_Dense<double,_2UL,_2UL> *)this;
  local_28 = Matrix_Dense<double,_0UL,_0UL>::size((Matrix_Dense<double,_0UL,_0UL> *)this);
  local_38 = Matrix_Dense<double,_2UL,_2UL>::size((Matrix_Dense<double,_2UL,_2UL> *)local_18);
  bVar1 = std::operator==(&local_28,&local_38);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    local_1f8 = 0;
    while( true ) {
      sVar3 = Matrix_Dense<double,_0UL,_0UL>::size_row((Matrix_Dense<double,_0UL,_0UL> *)this);
      if (sVar3 <= local_1f8) break;
      vector = std::array<Disa::Vector_Dense<double,_2UL>,_2UL>::operator[](local_18,local_1f8);
      this_00 = (Vector_Dense<double,0ul> *)
                std::
                vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                ::operator[]((vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                              *)this,local_1f8);
      Vector_Dense<double,0ul>::operator+=(this_00,vector);
      local_1f8 = local_1f8 + 1;
    }
    return (matrix_type *)this;
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,"\n");
  local_60 = &PTR_s__workspace_llm4binary_github_lic_001ede10;
  console_format_abi_cxx11_(&local_58,(Disa *)0x0,(Log_Level)&local_60,in_RCX);
  poVar2 = std::operator<<(poVar2,(string *)&local_58);
  sVar3 = Matrix_Dense<double,_0UL,_0UL>::size_row((Matrix_Dense<double,_0UL,_0UL> *)this);
  std::__cxx11::to_string(&local_190,sVar3);
  std::operator+(&local_170,"Incompatible matrix dimensions, ",&local_190);
  std::operator+(&local_150,&local_170,",");
  sVar3 = Matrix_Dense<double,_0UL,_0UL>::size_column((Matrix_Dense<double,_0UL,_0UL> *)this);
  std::__cxx11::to_string(&local_1b0,sVar3);
  std::operator+(&local_130,&local_150,&local_1b0);
  std::operator+(&local_110,&local_130," vs. ");
  sVar3 = Matrix_Dense<double,_2UL,_2UL>::size_row((Matrix_Dense<double,_2UL,_2UL> *)local_18);
  std::__cxx11::to_string(&local_1d0,sVar3);
  std::operator+(&local_f0,&local_110,&local_1d0);
  std::operator+(&local_d0,&local_f0,",");
  sVar3 = Matrix_Dense<double,_2UL,_2UL>::size_column((Matrix_Dense<double,_2UL,_2UL> *)local_18);
  std::__cxx11::to_string((string *)&row,sVar3);
  std::operator+(&local_b0,&local_d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&row);
  std::operator+(&local_90,&local_b0,".");
  poVar2 = std::operator<<(poVar2,(string *)&local_90);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&row);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&local_58);
  exit(1);
}

Assistant:

constexpr matrix_type& operator+=(const Matrix_Dense<_type, _row_other, _col_other>& matrix) {
    ASSERT_DEBUG(size() == matrix.size(), "Incompatible matrix dimensions, " + std::to_string(size_row()) + "," +
                                          std::to_string(size_column()) + " vs. " + std::to_string(matrix.size_row()) +
                                          "," + std::to_string(matrix.size_column()) + ".");
    FOR(row, size_row())(*this)[row] += matrix[row];
    return *this;
  }